

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O0

TypedAttribute<Imf_3_4::Rational> * __thiscall
Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Rational>>
          (Header *this,char *name)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator i;
  map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
  *in_stack_fffffffffffffeb8;
  Name *in_stack_fffffffffffffec0;
  TypedAttribute<Imf_3_4::Rational> *local_130;
  _Self local_120 [33];
  _Self local_18 [3];
  
  Name::Name(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
       ::find(in_stack_fffffffffffffeb8,(key_type *)0x230c85);
  local_120[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_4::Name,_Imf_3_4::Attribute_*,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>_>
       ::end(in_stack_fffffffffffffeb8);
  bVar1 = std::operator==(local_18,local_120);
  if (bVar1) {
    local_130 = (TypedAttribute<Imf_3_4::Rational> *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Attribute_*>_>
                         *)in_stack_fffffffffffffec0);
    if (ppVar2->second == (Attribute *)0x0) {
      local_130 = (TypedAttribute<Imf_3_4::Rational> *)0x0;
    }
    else {
      local_130 = (TypedAttribute<Imf_3_4::Rational> *)
                  __dynamic_cast(ppVar2->second,&Attribute::typeinfo,
                                 &TypedAttribute<Imf_3_4::Rational>::typeinfo,0);
    }
  }
  return local_130;
}

Assistant:

const T*
Header::findTypedAttribute (const char name[]) const
{
    AttributeMap::const_iterator i = _map.find (name);
    return (i == _map.end ()) ? 0 : dynamic_cast<const T*> (i->second);
}